

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenFunctionRunPasses
               (BinaryenFunctionRef func,BinaryenModuleRef module,char **passes,
               BinaryenIndex numPasses)

{
  ulong uVar1;
  undefined1 local_180 [88];
  __node_base_ptr *local_128;
  size_type local_120;
  __node_base local_118;
  size_type sStack_110;
  float local_108;
  size_t local_100;
  __node_base_ptr p_Stack_f8;
  __node_base_ptr *local_f0;
  size_type local_e8;
  __node_base local_e0;
  size_type sStack_d8;
  float local_d0;
  size_t local_c8;
  __node_base_ptr p_Stack_c0;
  element_type *local_b8;
  undefined1 auStack_b0 [16];
  __node_base_ptr *local_a0;
  size_type local_98;
  __node_base local_90;
  size_type sStack_88;
  float local_80;
  size_t local_78;
  __node_base_ptr p_Stack_70;
  string local_68;
  char **local_48;
  BinaryenFunctionRef local_40;
  allocator<char> local_31;
  
  local_180._0_8_ = &PTR__PassRunner_00d875f8;
  local_180._16_8_ = &module->allocator;
  local_180._24_8_ = (pointer)0x0;
  local_180[0x20] = 0;
  local_180._33_7_ = 0;
  local_180[0x28] = 0;
  local_180._41_7_ = 0;
  local_128 = &p_Stack_f8;
  local_120 = 1;
  local_118._M_nxt = (_Hash_node_base *)0x0;
  sStack_110 = 0;
  local_108 = 1.0;
  local_100 = 0;
  p_Stack_f8 = (__node_base_ptr)0x0;
  local_f0 = &p_Stack_c0;
  local_e8 = 1;
  local_e0._M_nxt = (_Hash_node_base *)0x0;
  sStack_d8 = 0;
  local_d0 = 1.0;
  local_a0 = &p_Stack_70;
  local_b8 = (element_type *)0x0;
  auStack_b0._0_7_ = 0;
  auStack_b0._7_4_ = 0;
  local_c8 = 0;
  p_Stack_c0 = (__node_base_ptr)0x0;
  local_98 = 1;
  local_90._M_nxt = (_Hash_node_base *)0x0;
  sStack_88 = 0;
  local_80 = 1.0;
  local_78 = 0;
  p_Stack_70 = (__node_base_ptr)0x0;
  local_180[0x30] = globalPassOptions.debug;
  local_180._49_2_ = globalPassOptions._1_2_;
  local_180[0x33] = globalPassOptions._3_1_;
  local_180._52_4_ = globalPassOptions.optimizeLevel;
  local_180._56_4_ = globalPassOptions.shrinkLevel;
  local_180._60_4_ = globalPassOptions.inlining.alwaysInlineMaxSize;
  local_180._64_4_ = globalPassOptions.inlining.oneCallerInlineMaxSize;
  local_180._68_4_ = globalPassOptions.inlining.flexibleInlineMaxSize;
  local_180._72_4_ = globalPassOptions.inlining._12_4_;
  local_180._76_4_ = globalPassOptions.inlining.partialInliningIfs;
  local_180._80_4_ = globalPassOptions._32_4_;
  local_180._84_4_ = globalPassOptions._36_4_;
  local_180._8_8_ = module;
  local_48 = passes;
  local_40 = func;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_128,&globalPassOptions.arguments._M_h);
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_f0,&globalPassOptions.passesToSkip._M_h);
  local_b8 = globalPassOptions.funcEffectsMap.
             super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_b0,
             &globalPassOptions.funcEffectsMap.
              super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if (numPasses != 0) {
    uVar1 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,local_48[uVar1],&local_31);
      wasm::PassRunner::add((PassRunner *)local_180,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      uVar1 = uVar1 + 1;
    } while (numPasses != uVar1);
  }
  wasm::PassRunner::runOnFunction((PassRunner *)local_180,local_40);
  wasm::PassRunner::~PassRunner((PassRunner *)local_180);
  return;
}

Assistant:

void BinaryenFunctionRunPasses(BinaryenFunctionRef func,
                               BinaryenModuleRef module,
                               const char** passes,
                               BinaryenIndex numPasses) {
  PassRunner passRunner((Module*)module);
  passRunner.options = globalPassOptions;
  for (BinaryenIndex i = 0; i < numPasses; i++) {
    passRunner.add(passes[i]);
  }
  passRunner.runOnFunction((Function*)func);
}